

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::MultiNodeChain<QtGraphicsAnchorLayout::GraphPath>::free
          (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *this,void *__ptr)

{
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *pMVar1;
  qsizetype nEntries;
  
  do {
    pMVar1 = this->next;
    QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
              (&(this->value).negatives.q_hash);
    QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
              ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)this);
    operator_delete(this,0x18);
    this = pMVar1;
  } while (pMVar1 != (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *)0x0);
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }